

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Renderer.cpp
# Opt level: O2

void __thiscall Renderer::setPatternRepeat(Renderer *this,bool repeat)

{
  bool bVar1;
  int __type;
  element_type *local_20;
  
  bVar1 = AudioStream::isEnabled(&this->mStream);
  if (bVar1) {
    Guarded<Renderer::RenderContext>::access
              ((Guarded<Renderer::RenderContext> *)&stack0xffffffffffffffd0,(char *)&this->mContext,
               __type);
    trackerboy::Engine::repeatPattern
              ((Engine *)&(local_20->mMap).mMap._M_elems[0]._M_h._M_single_bucket,repeat);
    QMutexLocker<QMutex>::unlock((QMutexLocker<QMutex> *)&stack0xffffffffffffffd0);
  }
  return;
}

Assistant:

void Renderer::setPatternRepeat(bool repeat) {

    if (mStream.isEnabled()) {
        mContext.access()->engine.repeatPattern(repeat);
    }
}